

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Impl::StdString::Equals::toString_abi_cxx11_
          (string *__return_storage_ptr__,Equals *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Equals *local_18;
  Equals *this_local;
  
  local_18 = this;
  this_local = (Equals *)__return_storage_ptr__;
  std::operator+(&local_38,"equals: \"",&this->m_str);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                return "equals: \"" + m_str + "\"";
            }